

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O2

QIcon __thiscall
QProxyStyle::standardIcon
          (QProxyStyle *this,StandardPixmap standardIcon,QStyleOption *option,QWidget *widget)

{
  QProxyStylePrivate *this_00;
  QObject *pQVar1;
  undefined4 in_register_00000034;
  
  this_00 = *(QProxyStylePrivate **)(CONCAT44(in_register_00000034,standardIcon) + 8);
  QProxyStylePrivate::ensureBaseStyle(this_00);
  pQVar1 = (this_00->baseStyle).wp.value;
  (**(code **)(*(long *)pQVar1 + 0x100))(this,pQVar1,(ulong)option & 0xffffffff,widget);
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon QProxyStyle::standardIcon(StandardPixmap standardIcon,
                                const QStyleOption *option,
                                const QWidget *widget) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->standardIcon(standardIcon, option, widget);
}